

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Straight_Test::TEST_DoublingFactorCounterTest_Straight_Test
          (TEST_DoublingFactorCounterTest_Straight_Test *this)

{
  TEST_DoublingFactorCounterTest_Straight_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_DoublingFactorCounterTest_Straight_Test_00251d20;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Straight)
{
	addPair(Tile::WestWind);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::FourOfCharacters, false);
	addSequence(Tile::SevenOfCharacters, false);
	addTriplet(Tile::OneOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::Straight));
	CHECK_EQUAL(2, r.doubling_factor);
}